

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DefaultCoverageBinInitializerSyntax>
          (DeepCloneVisitor *this,DefaultCoverageBinInitializerSyntax *node,BumpAllocator *alloc)

{
  DefaultCoverageBinInitializerSyntax *pDVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->defaultKeyword,alloc);
  local_38 = parsing::Token::deepClone(&node->sequenceKeyword,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultCoverageBinInitializerSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return (SyntaxNode *)pDVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }